

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

int GetSSE(uint8_t *a,uint8_t *b,int w,int h)

{
  int diff;
  int x;
  int y;
  int count;
  int h_local;
  int w_local;
  uint8_t *b_local;
  uint8_t *a_local;
  
  count = 0;
  b_local = b;
  a_local = a;
  for (y = 0; y < h; y = y + 1) {
    for (x = 0; x < w; x = x + 1) {
      count = ((uint)a_local[x] - (uint)b_local[x]) * ((uint)a_local[x] - (uint)b_local[x]) + count;
    }
    a_local = a_local + 0x20;
    b_local = b_local + 0x20;
  }
  return count;
}

Assistant:

static WEBP_INLINE int GetSSE(const uint8_t* a, const uint8_t* b,
                              int w, int h) {
  int count = 0;
  int y, x;
  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      const int diff = (int)a[x] - b[x];
      count += diff * diff;
    }
    a += BPS;
    b += BPS;
  }
  return count;
}